

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  uint *puVar2;
  undefined4 *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  int iVar12;
  parasail_result_t *ppVar13;
  __m128i *ptr;
  __m128i *palVar14;
  __m128i *ptr_00;
  int32_t *ptr_01;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  int iVar20;
  uint uVar21;
  __m128i *ptr_02;
  int iVar22;
  ulong uVar23;
  char *__format;
  int32_t iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  __m128i alVar39;
  int iVar41;
  undefined1 auVar40 [16];
  int iVar42;
  ulong uVar43;
  int iVar47;
  int iVar48;
  int iVar49;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i alVar46;
  int iVar50;
  int iVar52;
  int iVar53;
  undefined1 auVar51 [16];
  int iVar54;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar55 [16];
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  int local_c4;
  __m128i_32_t e;
  __m128i_32_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "profile";
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "profile->profile32.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar19 = "profile->matrix";
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar19 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "open";
        }
        else {
          if (-1 < gap) {
            uVar21 = uVar4 - 1;
            uVar17 = (ulong)uVar4 + 3 >> 2;
            uVar38 = (ulong)uVar21 % uVar17;
            iVar16 = (int)(uVar21 / uVar17);
            iVar22 = -open;
            iVar25 = ppVar6->min;
            uVar15 = 0x80000000 - iVar25;
            if (iVar25 != iVar22 && SBORROW4(iVar25,iVar22) == iVar25 + open < 0) {
              uVar15 = open | 0x80000000;
            }
            uVar11 = 0x7ffffffe - ppVar6->max;
            ppVar13 = parasail_result_new_rowcol1((uint)((ulong)uVar4 + 3) & 0x7ffffffc,s2Len);
            if (ppVar13 != (parasail_result_t *)0x0) {
              ppVar13->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x4440802;
              ptr = parasail_memalign___m128i(0x10,uVar17);
              palVar14 = parasail_memalign___m128i(0x10,uVar17);
              ptr_00 = parasail_memalign___m128i(0x10,uVar17);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              uVar23 = 0;
              if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (palVar14 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
                iVar12 = s2Len + -1;
                iVar20 = 3 - iVar16;
                iVar27 = uVar15 + 1;
                auVar29._4_4_ = iVar27;
                auVar29._0_4_ = iVar27;
                auVar29._8_4_ = iVar27;
                auVar29._12_4_ = iVar27;
                uVar15 = (uint)uVar17;
                iVar25 = iVar22;
                for (; uVar23 != uVar17; uVar23 = uVar23 + 1) {
                  iVar26 = iVar25;
                  for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
                    iVar52 = 0;
                    if (s1_beg == 0) {
                      iVar52 = iVar26;
                    }
                    *(int *)((long)&h + lVar18 * 4) = iVar52;
                    lVar28 = (long)iVar52 - (ulong)(uint)open;
                    if (lVar28 < -0x7fffffff) {
                      lVar28 = -0x80000000;
                    }
                    *(int *)((long)&e + lVar18 * 4) = (int)lVar28;
                    iVar26 = iVar26 - gap * uVar15;
                  }
                  ptr[uVar23][0] = h.m[0];
                  ptr[uVar23][1] = h.m[1];
                  ptr_00[uVar23][0] = e.m[0];
                  ptr_00[uVar23][1] = e.m[1];
                  iVar25 = iVar25 - gap;
                }
                *ptr_01 = 0;
                iVar25 = iVar22;
                for (uVar23 = 1; s2Len + 1 != uVar23; uVar23 = uVar23 + 1) {
                  iVar24 = 0;
                  if (s2_beg == 0) {
                    iVar24 = iVar25;
                  }
                  ptr_01[uVar23] = iVar24;
                  iVar25 = iVar25 - gap;
                }
                uVar23 = 0;
                auVar32 = auVar29;
                auVar40 = auVar29;
                iVar25 = iVar12;
                uVar34 = uVar11;
                uVar35 = uVar11;
                uVar36 = uVar11;
                uVar37 = uVar11;
                do {
                  ptr_02 = palVar14;
                  if (uVar23 == (uint)s2Len) {
                    uVar23 = uVar17 * 0xc;
                    for (lVar18 = 0; uVar17 * 4 != lVar18; lVar18 = lVar18 + 4) {
                      puVar3 = (undefined4 *)((long)*ptr + lVar18 * 4);
                      uVar8 = puVar3[1];
                      uVar9 = puVar3[2];
                      uVar10 = puVar3[3];
                      piVar1 = ((ppVar13->field_4).rowcols)->score_col;
                      *(undefined4 *)((long)piVar1 + lVar18) = *puVar3;
                      *(undefined4 *)((long)piVar1 + uVar17 * 4 + lVar18) = uVar8;
                      *(undefined4 *)((long)piVar1 + uVar17 * 8 + lVar18) = uVar9;
                      *(undefined4 *)((long)piVar1 + uVar23 + lVar18) = uVar10;
                    }
                    local_c4 = iVar27;
                    if (s2_end != 0) {
                      uVar23 = 0;
                      while( true ) {
                        uVar17 = auVar40._0_8_;
                        lVar18 = auVar40._8_8_;
                        if (iVar20 <= (int)uVar23) break;
                        auVar40._0_8_ = uVar17 << 0x20;
                        auVar40._8_8_ = lVar18 << 0x20 | uVar17 >> 0x20;
                        uVar23 = (ulong)((int)uVar23 + 1);
                      }
                      local_c4 = auVar40._12_4_;
                    }
                    iVar16 = (int)uVar23;
                    uVar59 = uVar21;
                    if (s1_end != 0) {
                      uVar17 = 0;
                      while( true ) {
                        iVar16 = (int)uVar23;
                        if ((uVar15 & 0x1fffffff) << 2 == (uint)uVar17) break;
                        uVar60 = ((uint)uVar17 & 3) * uVar15 + ((uint)(uVar17 >> 2) & 0x3fffffff);
                        uVar23 = (ulong)uVar60;
                        iVar16 = iVar25;
                        uVar61 = uVar59;
                        iVar22 = local_c4;
                        if (((int)uVar60 < (int)uVar4) &&
                           (iVar26 = *(int *)((long)*ptr + uVar17 * 4), iVar16 = iVar12,
                           uVar61 = uVar60, iVar22 = iVar26, iVar26 <= local_c4)) {
                          if ((int)uVar59 <= (int)uVar60) {
                            uVar60 = uVar59;
                          }
                          uVar23 = (ulong)uVar60;
                          iVar16 = iVar25;
                          uVar61 = uVar59;
                          iVar22 = local_c4;
                          if (iVar25 == iVar12 && iVar26 == local_c4) {
                            uVar61 = uVar60;
                          }
                        }
                        local_c4 = iVar22;
                        uVar59 = uVar61;
                        iVar25 = iVar16;
                        uVar17 = uVar17 + 1;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar39 = ptr[uVar38];
                      iVar16 = 0;
                      while( true ) {
                        uVar38 = alVar39[0];
                        lVar18 = alVar39[1];
                        if (iVar20 <= iVar16) break;
                        alVar39[0] = uVar38 << 0x20;
                        alVar39[1] = lVar18 << 0x20 | uVar38 >> 0x20;
                        iVar16 = iVar16 + 1;
                      }
                      local_c4 = alVar39[1]._4_4_;
                      iVar25 = iVar12;
                      uVar59 = uVar21;
                    }
                    auVar30._0_4_ = -(uint)((int)uVar34 < iVar27);
                    auVar30._4_4_ = -(uint)((int)uVar35 < iVar27);
                    auVar30._8_4_ = -(uint)((int)uVar36 < iVar27);
                    auVar30._12_4_ = -(uint)((int)uVar37 < iVar27);
                    auVar33._0_4_ = -(uint)((int)uVar11 < auVar32._0_4_);
                    auVar33._4_4_ = -(uint)((int)uVar11 < auVar32._4_4_);
                    auVar33._8_4_ = -(uint)((int)uVar11 < auVar32._8_4_);
                    auVar33._12_4_ = -(uint)((int)uVar11 < auVar32._12_4_);
                    iVar16 = movmskps(iVar16,auVar33 | auVar30);
                    if (iVar16 != 0) {
                      *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
                      local_c4 = 0;
                      iVar25 = 0;
                      uVar59 = 0;
                    }
                    ppVar13->score = local_c4;
                    ppVar13->end_query = uVar59;
                    ppVar13->end_ref = iVar25;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr);
                    return ppVar13;
                  }
                  iVar41 = ppVar6->mapper[(byte)s2[uVar23]];
                  palVar14 = ptr + (uVar15 - 1);
                  iVar26 = (int)(*palVar14)[0];
                  iVar52 = *(int *)((long)*palVar14 + 4);
                  iVar53 = (int)(*palVar14)[1];
                  iVar24 = ptr_01[uVar23];
                  auVar45 = auVar29;
                  for (lVar18 = 0; uVar17 * 0x10 != lVar18; lVar18 = lVar18 + 0x10) {
                    piVar1 = (int *)((long)pvVar5 + lVar18 + (long)(int)(iVar41 * uVar15) * 0x10);
                    iVar50 = iVar24 + *piVar1;
                    iVar26 = iVar26 + piVar1[1];
                    iVar52 = iVar52 + piVar1[2];
                    iVar53 = iVar53 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_00 + lVar18);
                    iVar54 = *piVar1;
                    iVar56 = piVar1[1];
                    iVar57 = piVar1[2];
                    iVar58 = piVar1[3];
                    iVar42 = auVar45._0_4_;
                    uVar59 = (uint)(iVar54 < iVar42) * iVar42 | (uint)(iVar54 >= iVar42) * iVar54;
                    iVar47 = auVar45._4_4_;
                    uVar60 = (uint)(iVar56 < iVar47) * iVar47 | (uint)(iVar56 >= iVar47) * iVar56;
                    iVar48 = auVar45._8_4_;
                    uVar61 = (uint)(iVar57 < iVar48) * iVar48 | (uint)(iVar57 >= iVar48) * iVar57;
                    iVar49 = auVar45._12_4_;
                    uVar62 = (uint)(iVar58 < iVar49) * iVar49 | (uint)(iVar58 >= iVar49) * iVar58;
                    uVar59 = (uint)((int)uVar59 < iVar50) * iVar50 |
                             ((int)uVar59 >= iVar50) * uVar59;
                    uVar60 = (uint)((int)uVar60 < iVar26) * iVar26 |
                             ((int)uVar60 >= iVar26) * uVar60;
                    uVar61 = (uint)((int)uVar61 < iVar52) * iVar52 |
                             ((int)uVar61 >= iVar52) * uVar61;
                    uVar62 = (uint)((int)uVar62 < iVar53) * iVar53 |
                             ((int)uVar62 >= iVar53) * uVar62;
                    puVar2 = (uint *)((long)*ptr_02 + lVar18);
                    *puVar2 = uVar59;
                    puVar2[1] = uVar60;
                    puVar2[2] = uVar61;
                    puVar2[3] = uVar62;
                    iVar26 = auVar32._0_4_;
                    auVar31._0_4_ =
                         (iVar26 < (int)uVar59) * uVar59 | (uint)(iVar26 >= (int)uVar59) * iVar26;
                    iVar26 = auVar32._4_4_;
                    auVar31._4_4_ =
                         (iVar26 < (int)uVar60) * uVar60 | (uint)(iVar26 >= (int)uVar60) * iVar26;
                    iVar26 = auVar32._8_4_;
                    iVar52 = auVar32._12_4_;
                    auVar31._8_4_ =
                         (iVar26 < (int)uVar61) * uVar61 | (uint)(iVar26 >= (int)uVar61) * iVar26;
                    auVar31._12_4_ =
                         (iVar52 < (int)uVar62) * uVar62 | (uint)(iVar52 >= (int)uVar62) * iVar52;
                    uVar34 = (uint)(iVar54 < (int)uVar34) * iVar54 |
                             (iVar54 >= (int)uVar34) * uVar34;
                    uVar35 = (uint)(iVar56 < (int)uVar35) * iVar56 |
                             (iVar56 >= (int)uVar35) * uVar35;
                    uVar36 = (uint)(iVar57 < (int)uVar36) * iVar57 |
                             (iVar57 >= (int)uVar36) * uVar36;
                    uVar37 = (uint)(iVar58 < (int)uVar37) * iVar58 |
                             (iVar58 >= (int)uVar37) * uVar37;
                    uVar34 = (uint)(iVar42 < (int)uVar34) * iVar42 |
                             (iVar42 >= (int)uVar34) * uVar34;
                    uVar35 = (uint)(iVar47 < (int)uVar35) * iVar47 |
                             (iVar47 >= (int)uVar35) * uVar35;
                    uVar36 = (uint)(iVar48 < (int)uVar36) * iVar48 |
                             (iVar48 >= (int)uVar36) * uVar36;
                    uVar37 = (uint)(iVar49 < (int)uVar37) * iVar49 |
                             (iVar49 >= (int)uVar37) * uVar37;
                    uVar34 = ((int)uVar59 < (int)uVar34) * uVar59 |
                             ((int)uVar59 >= (int)uVar34) * uVar34;
                    uVar35 = ((int)uVar60 < (int)uVar35) * uVar60 |
                             ((int)uVar60 >= (int)uVar35) * uVar35;
                    uVar36 = ((int)uVar61 < (int)uVar36) * uVar61 |
                             ((int)uVar61 >= (int)uVar36) * uVar36;
                    uVar37 = ((int)uVar62 < (int)uVar37) * uVar62 |
                             ((int)uVar62 >= (int)uVar37) * uVar37;
                    iVar26 = uVar59 - open;
                    iVar52 = uVar60 - open;
                    iVar53 = uVar61 - open;
                    iVar50 = uVar62 - open;
                    iVar54 = iVar54 - gap;
                    iVar56 = iVar56 - gap;
                    iVar57 = iVar57 - gap;
                    iVar58 = iVar58 - gap;
                    puVar2 = (uint *)((long)*ptr_00 + lVar18);
                    *puVar2 = (uint)(iVar54 < iVar26) * iVar26 | (uint)(iVar54 >= iVar26) * iVar54;
                    puVar2[1] = (uint)(iVar56 < iVar52) * iVar52 | (uint)(iVar56 >= iVar52) * iVar56
                    ;
                    puVar2[2] = (uint)(iVar57 < iVar53) * iVar53 | (uint)(iVar57 >= iVar53) * iVar57
                    ;
                    puVar2[3] = (uint)(iVar58 < iVar50) * iVar50 | (uint)(iVar58 >= iVar50) * iVar58
                    ;
                    iVar42 = iVar42 - gap;
                    iVar47 = iVar47 - gap;
                    iVar48 = iVar48 - gap;
                    iVar49 = iVar49 - gap;
                    auVar45._0_4_ =
                         (uint)(iVar42 < iVar26) * iVar26 | (uint)(iVar42 >= iVar26) * iVar42;
                    auVar45._4_4_ =
                         (uint)(iVar47 < iVar52) * iVar52 | (uint)(iVar47 >= iVar52) * iVar47;
                    auVar45._8_4_ =
                         (uint)(iVar48 < iVar53) * iVar53 | (uint)(iVar48 >= iVar53) * iVar48;
                    auVar45._12_4_ =
                         (uint)(iVar49 < iVar50) * iVar50 | (uint)(iVar49 >= iVar50) * iVar49;
                    piVar1 = (int *)((long)*ptr + lVar18);
                    iVar24 = *piVar1;
                    iVar26 = piVar1[1];
                    iVar52 = piVar1[2];
                    iVar53 = piVar1[3];
                    auVar32 = auVar31;
                  }
                  pcVar19 = s2;
                  for (iVar26 = 0; iVar26 != 4; iVar26 = iVar26 + 1) {
                    iVar52 = iVar22;
                    if (s2_beg == 0) {
                      iVar52 = ptr_01[uVar23 + 1] - open;
                    }
                    auVar44._0_4_ = auVar45._0_4_;
                    auVar44._4_4_ = auVar44._0_4_;
                    auVar44._8_4_ = auVar45._4_4_;
                    auVar44._12_4_ = auVar45._8_4_;
                    auVar45._4_4_ = auVar44._0_4_;
                    auVar45._0_4_ = iVar52;
                    auVar45._8_8_ = auVar44._8_8_;
                    lVar18 = 0;
                    auVar31 = auVar32;
                    while (uVar17 * 0x10 + 0x10 != lVar18 + 0x10) {
                      piVar1 = (int *)((long)*ptr_02 + lVar18);
                      iVar53 = *piVar1;
                      iVar41 = piVar1[1];
                      iVar42 = piVar1[2];
                      iVar47 = piVar1[3];
                      iVar52 = auVar45._0_4_;
                      uVar59 = (uint)(iVar53 < iVar52) * iVar52 | (uint)(iVar53 >= iVar52) * iVar53;
                      iVar53 = auVar45._4_4_;
                      uVar60 = (uint)(iVar41 < iVar53) * iVar53 | (uint)(iVar41 >= iVar53) * iVar41;
                      iVar41 = auVar45._8_4_;
                      uVar61 = (uint)(iVar42 < iVar41) * iVar41 | (uint)(iVar42 >= iVar41) * iVar42;
                      iVar42 = auVar45._12_4_;
                      uVar62 = (uint)(iVar47 < iVar42) * iVar42 | (uint)(iVar47 >= iVar42) * iVar47;
                      puVar2 = (uint *)((long)*ptr_02 + lVar18);
                      *puVar2 = uVar59;
                      puVar2[1] = uVar60;
                      puVar2[2] = uVar61;
                      puVar2[3] = uVar62;
                      uVar34 = ((int)uVar59 < (int)uVar34) * uVar59 |
                               ((int)uVar59 >= (int)uVar34) * uVar34;
                      uVar35 = ((int)uVar60 < (int)uVar35) * uVar60 |
                               ((int)uVar60 >= (int)uVar35) * uVar35;
                      uVar36 = ((int)uVar61 < (int)uVar36) * uVar61 |
                               ((int)uVar61 >= (int)uVar36) * uVar36;
                      uVar37 = ((int)uVar62 < (int)uVar37) * uVar62 |
                               ((int)uVar62 >= (int)uVar37) * uVar37;
                      iVar47 = auVar31._0_4_;
                      auVar32._0_4_ =
                           (iVar47 < (int)uVar59) * uVar59 | (uint)(iVar47 >= (int)uVar59) * iVar47;
                      iVar47 = auVar31._4_4_;
                      auVar32._4_4_ =
                           (iVar47 < (int)uVar60) * uVar60 | (uint)(iVar47 >= (int)uVar60) * iVar47;
                      iVar47 = auVar31._8_4_;
                      iVar48 = auVar31._12_4_;
                      auVar32._8_4_ =
                           (iVar47 < (int)uVar61) * uVar61 | (uint)(iVar47 >= (int)uVar61) * iVar47;
                      auVar32._12_4_ =
                           (iVar48 < (int)uVar62) * uVar62 | (uint)(iVar48 >= (int)uVar62) * iVar48;
                      auVar45._0_4_ = iVar52 - gap;
                      auVar45._4_4_ = iVar53 - gap;
                      auVar45._8_4_ = iVar41 - gap;
                      auVar45._12_4_ = iVar42 - gap;
                      auVar55._0_4_ = -(uint)((int)(uVar59 - open) < (int)auVar45._0_4_);
                      auVar55._4_4_ = -(uint)((int)(uVar60 - open) < (int)auVar45._4_4_);
                      auVar55._8_4_ = -(uint)((int)(uVar61 - open) < (int)auVar45._8_4_);
                      auVar55._12_4_ = -(uint)((int)(uVar62 - open) < (int)auVar45._12_4_);
                      uVar59 = movmskps((int)pcVar19,auVar55);
                      pcVar19 = (char *)(ulong)uVar59;
                      lVar18 = lVar18 + 0x10;
                      auVar31 = auVar32;
                      if (uVar59 == 0) goto LAB_006b4a72;
                    }
                    auVar32 = auVar31;
                  }
LAB_006b4a72:
                  alVar46 = ptr_02[uVar38];
                  iVar26 = auVar40._0_4_;
                  iVar42 = (int)alVar46[0];
                  auVar51._0_4_ = -(uint)(iVar26 < iVar42);
                  iVar52 = auVar40._4_4_;
                  iVar47 = alVar46[0]._4_4_;
                  auVar51._4_4_ = -(uint)(iVar52 < iVar47);
                  iVar53 = auVar40._8_4_;
                  iVar48 = (int)alVar46[1];
                  iVar49 = alVar46[1]._4_4_;
                  auVar51._8_4_ = -(uint)(iVar53 < iVar48);
                  iVar41 = auVar40._12_4_;
                  auVar51._12_4_ = -(uint)(iVar41 < iVar49);
                  auVar7._4_4_ = -(uint)(iVar20 == 2);
                  auVar7._0_4_ = -(uint)(iVar20 == 3);
                  auVar7._8_4_ = -(uint)(iVar20 == 1);
                  auVar7._12_4_ = -(uint)(iVar16 == 3);
                  auVar51 = auVar51 & auVar7;
                  auVar40._0_4_ =
                       (uint)(iVar26 < iVar42) * iVar42 | (uint)(iVar26 >= iVar42) * iVar26;
                  auVar40._4_4_ =
                       (uint)(iVar52 < iVar47) * iVar47 | (uint)(iVar52 >= iVar47) * iVar52;
                  auVar40._8_4_ =
                       (uint)(iVar53 < iVar48) * iVar48 | (uint)(iVar53 >= iVar48) * iVar53;
                  auVar40._12_4_ =
                       (uint)(iVar41 < iVar49) * iVar49 | (uint)(iVar41 >= iVar49) * iVar41;
                  iVar26 = 0;
                  while( true ) {
                    uVar43 = alVar46[0];
                    lVar18 = alVar46[1];
                    if (iVar20 <= iVar26) break;
                    alVar46[0] = uVar43 << 0x20;
                    alVar46[1] = lVar18 << 0x20 | uVar43 >> 0x20;
                    iVar26 = iVar26 + 1;
                  }
                  if ((((((((((((((((auVar51 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar51 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar51 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar51 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar51 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar51 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar51 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar51 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar51 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar51 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar51 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar51 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar51 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar51[0xf] < '\0') {
                    iVar25 = (int)uVar23;
                  }
                  ((ppVar13->field_4).rowcols)->score_row[uVar23] = alVar46[1]._4_4_;
                  uVar23 = uVar23 + 1;
                  palVar14 = ptr;
                  ptr = ptr_02;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_rowcol_striped_profile_sse41_128_32",pcVar19);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}